

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O0

REF_STATUS ref_grid_parse_unit(REF_GRID ref_grid,char *unit)

{
  int iVar1;
  bool bVar2;
  char *unit_local;
  REF_GRID ref_grid_local;
  
  ref_grid->unit = REF_GRID_UNIT_LAST;
  iVar1 = strcmp("in",unit);
  if (iVar1 == 0) {
    ref_grid->unit = REF_GRID_IN;
  }
  iVar1 = strcmp("ft",unit);
  if (iVar1 == 0) {
    ref_grid->unit = REF_GRID_FT;
  }
  iVar1 = strcmp("m",unit);
  if (iVar1 == 0) {
    ref_grid->unit = REF_GRID_M;
  }
  iVar1 = strcmp("cm",unit);
  if (iVar1 == 0) {
    ref_grid->unit = REF_GRID_CM;
  }
  bVar2 = ref_grid->unit == REF_GRID_UNIT_LAST;
  if (bVar2) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0xed,
           "ref_grid_parse_unit","mesh_units not recognized");
  }
  ref_grid_local._4_4_ = (uint)bVar2;
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_grid_parse_unit(REF_GRID ref_grid, const char *unit) {
  ref_grid_unit(ref_grid) = REF_GRID_UNIT_LAST;
  if (0 == strcmp("in", unit)) ref_grid_unit(ref_grid) = REF_GRID_IN;
  if (0 == strcmp("ft", unit)) ref_grid_unit(ref_grid) = REF_GRID_FT;
  if (0 == strcmp("m", unit)) ref_grid_unit(ref_grid) = REF_GRID_M;
  if (0 == strcmp("cm", unit)) ref_grid_unit(ref_grid) = REF_GRID_CM;
  RUS(REF_GRID_UNIT_LAST, ref_grid_unit(ref_grid), "mesh_units not recognized");
  return REF_SUCCESS;
}